

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall
cmComputeComponentGraph::cmComputeComponentGraph(cmComputeComponentGraph *this,Graph *input)

{
  Graph *input_local;
  cmComputeComponentGraph *this_local;
  
  this->InputGraph = input;
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->ComponentGraph);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->TarjanVisited);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->TarjanComponents);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::vector(&this->TarjanEntries);
  std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::vector(&this->Components);
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
             &this->TarjanStack);
  return;
}

Assistant:

cmComputeComponentGraph::cmComputeComponentGraph(Graph const& input)
  : InputGraph(input)
{
}